

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# division_operations.c
# Opt level: O1

int32_t WebRtcSpl_DivW32HiLow(int32_t num,int16_t den_hi,int16_t den_low)

{
  uint uVar1;
  int iVar2;
  
  if (den_hi == 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = (int)(short)(0x1fffffff / (long)(int)den_hi);
  }
  uVar1 = (den_low * iVar2 >> 0xe & 0xfffffffeU) + den_hi * iVar2 * 2 ^ 0x7fffffff;
  uVar1 = ((int)((uVar1 >> 1 & 0x7fff) * iVar2) >> 0xf) + (uVar1 >> 0x10) * iVar2;
  iVar2 = (int)(short)(uVar1 >> 0xf);
  return (((int)(((uint)num >> 1 & 0x7fff) * iVar2) >> 0xf) +
         ((int)((uVar1 & 0x7fff) * (num >> 0x10)) >> 0xf) + iVar2 * (num >> 0x10)) * 8;
}

Assistant:

int32_t WebRtcSpl_DivW32HiLow(int32_t num, int16_t den_hi, int16_t den_low)
{
    int16_t approx, tmp_hi, tmp_low, num_hi, num_low;
    int32_t tmpW32;

    approx = (int16_t)WebRtcSpl_DivW32W16((int32_t)0x1FFFFFFF, den_hi);
    // result in Q14 (Note: 3FFFFFFF = 0.5 in Q30)

    // tmpW32 = 1/den = approx * (2.0 - den * approx) (in Q30)
    tmpW32 = (den_hi * approx << 1) + ((den_low * approx >> 15) << 1);
    // tmpW32 = den * approx

    tmpW32 = (int32_t)0x7fffffffL - tmpW32; // result in Q30 (tmpW32 = 2.0-(den*approx))

    // Store tmpW32 in hi and low format
    tmp_hi = (int16_t)(tmpW32 >> 16);
    tmp_low = (int16_t)((tmpW32 - ((int32_t)tmp_hi << 16)) >> 1);

    // tmpW32 = 1/den in Q29
    tmpW32 = (tmp_hi * approx + (tmp_low * approx >> 15)) << 1;

    // 1/den in hi and low format
    tmp_hi = (int16_t)(tmpW32 >> 16);
    tmp_low = (int16_t)((tmpW32 - ((int32_t)tmp_hi << 16)) >> 1);

    // Store num in hi and low format
    num_hi = (int16_t)(num >> 16);
    num_low = (int16_t)((num - ((int32_t)num_hi << 16)) >> 1);

    // num * (1/den) by 32 bit multiplication (result in Q28)

    tmpW32 = num_hi * tmp_hi + (num_hi * tmp_low >> 15) +
        (num_low * tmp_hi >> 15);

    // Put result in Q31 (convert from Q28)
    tmpW32 = WEBRTC_SPL_LSHIFT_W32(tmpW32, 3);

    return tmpW32;
}